

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>,_20>::TPZManVector
          (TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>,_20> *this,int64_t size)

{
  ulong uVar1;
  undefined8 *puVar2;
  int64_t *piVar3;
  int64_t iVar4;
  ulong uVar5;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *pTVar6;
  long lVar7;
  
  (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fStore =
       (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)0x0;
  (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNElements = 0;
  (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNAlloc = 0;
  (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01850750;
  pTVar6 = this->fExtAlloc;
  lVar7 = 0;
  do {
    puVar2 = (undefined8 *)operator_new(0x10);
    *puVar2 = 0;
    *(undefined4 *)(puVar2 + 1) = 0;
    LOCK();
    *(undefined4 *)(puVar2 + 1) = 1;
    UNLOCK();
    *(undefined8 **)((long)&this->fExtAlloc[0].fRef + lVar7) = puVar2;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0xa0);
  if (size < 0x15) {
    iVar4 = 0;
  }
  else {
    uVar1 = size * 8;
    uVar5 = 0xffffffffffffffff;
    if (uVar1 < 0xfffffffffffffff8) {
      uVar5 = uVar1 + 8;
    }
    piVar3 = (int64_t *)operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | uVar5);
    *piVar3 = size;
    pTVar6 = (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)(piVar3 + 1);
    lVar7 = 0;
    do {
      puVar2 = (undefined8 *)operator_new(0x10);
      *puVar2 = 0;
      *(undefined4 *)(puVar2 + 1) = 0;
      LOCK();
      *(undefined4 *)(puVar2 + 1) = 1;
      UNLOCK();
      *(undefined8 **)((long)piVar3 + lVar7 + 8) = puVar2;
      lVar7 = lVar7 + 8;
      iVar4 = size;
    } while (uVar1 - lVar7 != 0);
  }
  (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fStore = pTVar6;
  (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNElements = size;
  (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNAlloc = iVar4;
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}